

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteAnimationLibrary(ColladaExporter *this,size_t pIndex)

{
  pointer pbVar1;
  float fVar2;
  aiNodeAnim *paVar3;
  aiVectorKey *paVar4;
  aiQuatKey *paVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long *plVar10;
  size_t sVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  aiAnimation *paVar14;
  char *pcVar15;
  long lVar16;
  undefined8 uVar17;
  uint j;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  vector<float,_std::allocator<float>_> keyframes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string node_idstr;
  string idstrEscaped;
  string ending;
  string idstr;
  vector<float,_std::allocator<float>_> frames;
  string animation_name_escaped;
  string local_348;
  ostream *local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string *local_2b8;
  string local_2b0;
  aiAnimation *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  float local_268;
  float local_264;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  char *local_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [12];
  float fStack_21c;
  undefined8 local_218;
  float local_210;
  float local_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float local_1fc;
  ios_base local_1c8 [272];
  string local_b8;
  undefined1 local_98 [16];
  ulong local_80;
  string local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  paVar14 = this->mScene->mAnimations[pIndex];
  if (((paVar14->mNumChannels == 0) && (paVar14->mNumMeshChannels == 0)) &&
     (paVar14->mNumMorphMeshChannels == 0)) {
    return;
  }
  pcVar15 = (paVar14->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,pcVar15,(allocator<char> *)&local_260);
  XMLEscape(&local_78,(string *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228._0_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,pcVar15,(allocator<char> *)local_238);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"AnimId","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::ostream::_M_insert<unsigned_long>((ulong)local_238);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    uVar17 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_2d8._8_8_ + local_2b0._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      uVar17 = local_2c8._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_2d8._8_8_ + local_2b0._M_string_length) goto LAB_00317948;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_00317948:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b0,local_2d8._M_allocated_capacity);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_288.field_2._M_allocated_capacity = *psVar12;
    local_288.field_2._8_8_ = puVar8[3];
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar12;
    local_288._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_288._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_allocated_capacity != &local_2c8) {
    operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_260._M_string_length < local_288._M_string_length) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   &local_260,&local_288);
    std::__cxx11::string::operator=((string *)&local_260,(string *)local_238);
    if (local_238 == (undefined1  [8])local_228) goto LAB_00317ac3;
  }
  else {
    iVar6 = std::__cxx11::string::compare
                      ((ulong)&local_260,local_260._M_string_length - local_288._M_string_length,
                       (string *)local_288._M_string_length);
    if (iVar6 == 0) goto LAB_00317ac3;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   &local_260,&local_288);
    std::__cxx11::string::operator=((string *)&local_260,(string *)local_238);
    if (local_238 == (undefined1  [8])local_228) goto LAB_00317ac3;
  }
  operator_delete((void *)local_238,local_228._0_8_ + 1);
LAB_00317ac3:
  XMLIDEncode(&local_2b0,&local_260);
  local_320 = (ostream *)&this->field_0x38;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_320,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
  ;
  std::operator+(&local_318,"<animation id=\"",&local_2b0);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_318);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_348.field_2._M_allocated_capacity = *psVar12;
    local_348.field_2._8_8_ = plVar10[3];
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar12;
    local_348._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_348._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_348,(ulong)local_78._M_dataplus._M_p);
  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar13) {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c8._8_8_ = plVar10[3];
  }
  else {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2d8._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar10;
  }
  local_2d8._8_8_ = plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_2d8._M_local_buf);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar12) {
    local_228._0_8_ = *psVar12;
    unique0x100014fe = plVar10[3];
    local_238 = (undefined1  [8])local_228;
  }
  else {
    local_228._0_8_ = *psVar12;
    local_238 = (undefined1  [8])*plVar10;
  }
  uStack_230 = (pointer)plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_238,(long)uStack_230);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_allocated_capacity != &local_2c8) {
    operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  local_2b8 = &this->startstr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_2b8);
  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
  local_2d8._8_8_ = 0;
  local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
  uVar7 = paVar14->mNumChannels;
  if (uVar7 != 0) {
    uVar18 = 0;
    local_290 = paVar14;
    do {
      paVar3 = paVar14->mChannels[uVar18];
      if ((paVar3->mNumPositionKeys == paVar3->mNumScalingKeys) &&
         (paVar3->mNumPositionKeys == paVar3->mNumRotationKeys)) {
        local_2d8._8_8_ = 0;
        local_80 = uVar18;
        *(char *)local_2d8._M_allocated_capacity = '\0';
        local_240 = (paVar3->mNodeName).data;
        std::__cxx11::string::append(local_2d8._M_local_buf);
        local_238 = (undefined1  [8])local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"_matrix-input","");
        std::__cxx11::string::_M_append(local_2d8._M_local_buf,(ulong)local_238);
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238,local_228._0_8_ + 1);
        }
        local_238 = (undefined1  [8])0x0;
        uStack_230 = (ai_real *)0x0;
        local_228._0_8_ = 0;
        if (paVar3->mNumPositionKeys != 0) {
          lVar16 = 0;
          uVar18 = 0;
          do {
            local_348._M_dataplus._M_p._0_4_ =
                 (float)*(double *)((long)&paVar3->mPositionKeys->mTime + lVar16);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      ((vector<float,_std::allocator<float>_> *)local_238,(float *)&local_348);
            uVar18 = uVar18 + 1;
            lVar16 = lVar16 + 0x18;
          } while (uVar18 < paVar3->mNumPositionKeys);
        }
        WriteFloatArray(this,(string *)&local_2d8,FloatType_Time,(ai_real *)local_238,
                        (long)uStack_230 - (long)local_238 >> 2);
        if ((undefined1  [8])uStack_230 != local_238) {
          uStack_230 = (pointer)local_238;
        }
        if (local_238 != (undefined1  [8])0x0) {
          operator_delete((void *)local_238,local_228._0_8_ - (long)local_238);
        }
        local_2d8._8_8_ = 0;
        *(char *)local_2d8._M_allocated_capacity = '\0';
        std::__cxx11::string::append(local_2d8._M_local_buf);
        local_238 = (undefined1  [8])local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"_matrix-output","");
        std::__cxx11::string::_M_append(local_2d8._M_local_buf,(ulong)local_238);
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238,local_228._0_8_ + 1);
        }
        local_348._M_dataplus._M_p = (pointer)0x0;
        local_348._M_string_length = 0;
        local_348.field_2._M_allocated_capacity = 0;
        std::vector<float,_std::allocator<float>_>::reserve
                  ((vector<float,_std::allocator<float>_> *)&local_348,
                   (ulong)(paVar3->mNumPositionKeys << 4));
        if (paVar3->mNumPositionKeys != 0) {
          uVar18 = 0;
          do {
            paVar4 = paVar3->mPositionKeys;
            paVar5 = paVar3->mRotationKeys;
            fVar19 = paVar5[uVar18].mValue.w;
            fVar37 = paVar5[uVar18].mValue.x;
            fVar2 = paVar5[uVar18].mValue.y;
            fVar22 = paVar5[uVar18].mValue.z;
            fVar33 = fVar2 * fVar2 + fVar22 * fVar22;
            fVar39 = 1.0 - (fVar33 + fVar33);
            fVar27 = fVar37 * fVar22 + fVar19 * fVar2;
            fVar27 = fVar27 + fVar27;
            fVar33 = fVar37 * fVar2 + fVar19 * fVar22;
            fVar33 = fVar33 + fVar33;
            fVar36 = fVar22 * fVar2 - fVar19 * fVar37;
            fVar36 = fVar36 + fVar36;
            fVar30 = fVar37 * fVar22 - fVar19 * fVar2;
            fVar30 = fVar30 + fVar30;
            fVar21 = fVar19 * fVar37 + fVar22 * fVar2;
            fVar21 = fVar21 + fVar21;
            local_264 = paVar4[uVar18].mValue.x;
            fVar40 = fVar33 * 0.0;
            fVar20 = fVar30 * 0.0;
            local_58 = ZEXT416((uint)fVar20);
            fVar34 = local_264 * 0.0;
            fVar32 = fVar39 + fVar40 + fVar20 + fVar34;
            fVar26 = (fVar22 * fVar22 + fVar37 * fVar37) * -2.0 + 1.0;
            fVar22 = (fVar2 * fVar37 + -fVar22 * fVar19) * 2.0;
            fVar25 = fVar26 * 0.0;
            fVar39 = fVar39 * 0.0;
            fVar40 = fVar39 + fVar40;
            fVar19 = fVar36 * 0.0;
            fVar23 = fVar22 * 0.0;
            fVar24 = fVar23 + fVar25;
            fVar31 = fVar21 * 0.0;
            fVar35 = fVar22 + fVar25 + fVar31 + fVar34;
            fVar37 = (fVar37 * fVar37 + fVar2 * fVar2) * -2.0 + 1.0;
            fVar38 = fVar19 + fVar27 * 0.0;
            fVar28 = fVar37 * 0.0;
            fVar34 = fVar27 + fVar19 + fVar28 + fVar34;
            local_268 = paVar4[uVar18].mValue.y;
            fVar29 = local_268 * 0.0;
            fVar25 = fVar33 + fVar39 + fVar20 + fVar29;
            fVar39 = fVar26 + fVar23 + fVar31 + fVar29;
            fVar29 = fVar27 * 0.0 + fVar36 + fVar28 + fVar29;
            fVar19 = paVar4[uVar18].mValue.z;
            local_48 = ZEXT416((uint)fVar19);
            fVar33 = fVar19 * 0.0;
            fVar23 = fVar30 + fVar40 + fVar33;
            local_98 = ZEXT416((uint)fVar23);
            fVar26 = fVar21 + fVar24 + fVar33;
            fVar33 = fVar37 + fVar38 + fVar33;
            paVar4 = paVar3->mScalingKeys;
            fVar22 = paVar4[uVar18].mValue.y;
            fVar30 = fVar35 * 0.0;
            fVar37 = paVar4[uVar18].mValue.x;
            fVar27 = fVar32 * 0.0 + fVar30;
            fVar2 = paVar4[uVar18].mValue.z;
            fVar36 = fVar34 * 0.0;
            fVar21 = (local_264 + 0.0) * 0.0;
            local_238 = (undefined1  [8])
                        CONCAT44(fVar21 + fVar36 + fVar32 * 0.0 + fVar35 * fVar22,
                                 fVar21 + fVar36 + fVar32 * fVar37 + fVar30);
            uStack_230 = (pointer)CONCAT44(fVar27 + fVar36 + local_264 + 0.0,
                                           fVar2 * fVar34 + fVar27 + fVar21);
            fVar27 = fVar39 * 0.0;
            fVar21 = fVar25 * 0.0 + fVar27;
            fVar30 = fVar29 * 0.0;
            fVar32 = (local_268 + 0.0) * 0.0;
            local_228._0_8_ =
                 CONCAT44(fVar32 + fVar30 + fVar25 * 0.0 + fVar39 * fVar22,
                          fVar32 + fVar30 + fVar25 * fVar37 + fVar27);
            fVar24 = fVar24 + fVar31 + 0.0;
            fVar39 = fVar24 * 0.0;
            fStack_21c = fVar21 + fVar30 + local_268 + 0.0;
            local_228._8_4_ = fVar2 * fVar29 + fVar21 + fVar32;
            fVar25 = fVar26 * 0.0;
            fVar29 = fVar40 + fVar20 + 0.0;
            fVar27 = (fVar19 + 0.0) * 0.0;
            fVar20 = fVar25 + fVar23 * 0.0;
            fVar21 = fVar39 + fVar29 * 0.0;
            local_210 = fVar2 * fVar33 + fVar20 + fVar27;
            local_218 = CONCAT44(fVar27 + fVar33 * 0.0 + fVar23 * 0.0 + fVar26 * fVar22,
                                 fVar27 + fVar33 * 0.0 + fVar23 * fVar37 + fVar25);
            fVar23 = fVar38 + fVar28 + 0.0;
            local_20c = fVar19 + 0.0 + fVar33 * 0.0 + fVar20;
            fStack_208 = fVar23 * 0.0 + fVar39 + fVar29 * fVar37 + 0.0;
            fStack_204 = fVar23 * 0.0 + fVar24 * fVar22 + fVar29 * 0.0 + 0.0;
            fStack_200 = fVar23 * fVar2 + fVar21 + 0.0;
            local_1fc = fVar23 * 0.0 + fVar21 + 1.0;
            iVar6 = 0;
            pcVar15 = local_238;
            do {
              std::vector<float,std::allocator<float>>::_M_range_insert<float*>
                        ((vector<float,std::allocator<float>> *)&local_348,
                         local_348._M_string_length,pcVar15,pcVar15 + 0x10);
              iVar6 = iVar6 + 1;
              pcVar15 = local_228;
            } while (iVar6 != 4);
            uVar18 = uVar18 + 1;
          } while (uVar18 < paVar3->mNumPositionKeys);
        }
        WriteFloatArray(this,(string *)&local_2d8,FloatType_Mat4x4,
                        (ai_real *)local_348._M_dataplus._M_p,
                        (ulong)((long)(local_348._M_string_length - (long)local_348._M_dataplus._M_p
                                      ) >> 2) >> 4);
        if ((ai_real *)local_348._M_dataplus._M_p != (ai_real *)0x0) {
          operator_delete(local_348._M_dataplus._M_p,
                          local_348.field_2._M_allocated_capacity - (long)local_348._M_dataplus._M_p
                         );
        }
        local_2f8._0_8_ = (pointer)0x0;
        local_2f8._8_8_ = (pointer)0x0;
        local_2f8._16_8_ = (pointer)0x0;
        if (paVar3->mNumPositionKeys != 0) {
          uVar18 = 0;
          do {
            if ((paVar3->mPreState < 4) && (paVar3->mPreState != aiAnimBehaviour_CONSTANT)) {
              local_238 = (undefined1  [8])local_228;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"LINEAR","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238);
LAB_0031853c:
              if (local_238 != (undefined1  [8])local_228) {
                operator_delete((void *)local_238,local_228._0_8_ + 1);
              }
            }
            else if (paVar3->mPostState == aiAnimBehaviour_CONSTANT) {
              local_238 = (undefined1  [8])local_228;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"STEP","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238);
              goto LAB_0031853c;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < paVar3->mNumPositionKeys);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_348,"_matrix-interpolation","");
        pcVar15 = local_240;
        strlen(local_240);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_348,0,(char *)0x0,(ulong)pcVar15);
        local_238 = (undefined1  [8])local_228;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar12) {
          local_228._0_8_ = *psVar12;
          unique0x1000151e = plVar10[3];
        }
        else {
          local_228._0_8_ = *psVar12;
          local_238 = (undefined1  [8])*plVar10;
        }
        uStack_230 = (pointer)plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        XMLIDEncode(&local_318,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::__cxx11::string::append((char *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<source id=\"",0xc);
        XMLIDEncode(&local_318,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_318._M_dataplus._M_p,local_318._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)local_2b8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<Name_array id=\"",0x10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" count=\"",9);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"> ",3);
        if (local_2f8._8_8_ != local_2f8._0_8_) {
          lVar16 = 8;
          uVar18 = 0;
          do {
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_320,*(char **)(local_2f8._0_8_ + lVar16 + -8),
                                *(long *)(local_2f8._0_8_ + lVar16));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            uVar18 = uVar18 + 1;
            lVar16 = lVar16 + 0x20;
          } while (uVar18 < (ulong)((long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5));
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_320,"</Name_array>",0xd);
        paVar14 = local_290;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_320,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<technique_common>",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_2b8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<accessor source=\"#",0x13);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" count=\"",9);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" stride=\"",10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_2b8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"<param name=\"INTERPOLATION\" type=\"name\"></param>",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</accessor>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</technique_common>",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</source>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238,local_228._0_8_ + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        uVar7 = paVar14->mNumChannels;
        uVar18 = local_80;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar7);
    if (uVar7 != 0) {
      pbVar1 = (pointer)(local_2f8 + 0x10);
      uVar18 = 0;
      do {
        paVar3 = paVar14->mChannels[uVar18];
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"_matrix-sampler","");
        pcVar15 = (paVar3->mNodeName).data;
        strlen(pcVar15);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_348,0,(char *)0x0,(ulong)pcVar15);
        local_238 = (undefined1  [8])local_228;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar12) {
          local_228._0_8_ = *psVar12;
          unique0x1000153e = plVar10[3];
        }
        else {
          local_228._0_8_ = *psVar12;
          local_238 = (undefined1  [8])*plVar10;
        }
        uStack_230 = (pointer)plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<sampler id=\"",0xd);
        XMLIDEncode(&local_348,(string *)local_238);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)local_2b8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"<input semantic=\"INPUT\" source=\"#",0x21);
        local_2f8._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"_matrix-input","");
        strlen(pcVar15);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_2f8,0,(char *)0x0,(ulong)pcVar15);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318.field_2._8_8_ = plVar10[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_318._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        XMLIDEncode(&local_348,&local_318);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2f8._0_8_ != pbVar1) {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"<input semantic=\"OUTPUT\" source=\"#",0x22);
        local_2f8._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"_matrix-output","");
        strlen(pcVar15);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_2f8,0,(char *)0x0,(ulong)pcVar15);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318.field_2._8_8_ = plVar10[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_318._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        XMLIDEncode(&local_348,&local_318);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2f8._0_8_ != pbVar1) {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"<input semantic=\"INTERPOLATION\" source=\"#",0x29);
        local_2f8._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f8,"_matrix-interpolation","");
        strlen(pcVar15);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_2f8,0,(char *)0x0,(ulong)pcVar15);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318.field_2._8_8_ = plVar10[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_318._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        XMLIDEncode(&local_348,&local_318);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2f8._0_8_ != pbVar1) {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        PopTag(this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_320,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</sampler>",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238,local_228._0_8_ + 1);
        }
        uVar18 = uVar18 + 1;
        paVar14 = local_290;
      } while (uVar18 < local_290->mNumChannels);
      if (local_290->mNumChannels != 0) {
        uVar18 = 0;
        do {
          paVar3 = local_290->mChannels[uVar18];
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_320,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<channel source=\"#",0x12);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"_matrix-sampler","")
          ;
          pcVar15 = (paVar3->mNodeName).data;
          strlen(pcVar15);
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_318,0,(char *)0x0,(ulong)pcVar15);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_348.field_2._M_allocated_capacity = *psVar12;
            local_348.field_2._8_8_ = plVar10[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar12;
            local_348._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_348._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          XMLIDEncode((string *)local_238,&local_348);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_238,(long)uStack_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" target=\"",10);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          sVar11 = strlen(pcVar15);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar15,pcVar15 + sVar11);
          XMLIDEncode((string *)local_2f8,&local_b8);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_2f8._0_8_,local_2f8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/matrix\"/>",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((pointer)local_2f8._0_8_ != pbVar1) {
            operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_238 != (undefined1  [8])local_228) {
            operator_delete((void *)local_238,local_228._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_290->mNumChannels);
      }
    }
  }
  PopTag(this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_320,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</animation>",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_allocated_capacity != &local_2c8) {
    operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationLibrary(size_t pIndex)
{
	const aiAnimation * anim = mScene->mAnimations[pIndex];
	
	if ( anim->mNumChannels == 0 && anim->mNumMeshChannels == 0 && anim->mNumMorphMeshChannels ==0 )
		return;
	
	const std::string animation_name_escaped = XMLEscape( anim->mName.C_Str() );
	std::string idstr = anim->mName.C_Str();
	std::string ending = std::string( "AnimId" ) + to_string(pIndex);
	if (idstr.length() >= ending.length()) {
		if (0 != idstr.compare (idstr.length() - ending.length(), ending.length(), ending)) {
			idstr = idstr + ending;
		}
	} else {
		idstr = idstr + ending;
	}

	const std::string idstrEscaped = XMLIDEncode(idstr);
	
	mOutput << startstr << "<animation id=\"" + idstrEscaped + "\" name=\"" + animation_name_escaped + "\">" << endstr;
	PushTag();

    std::string node_idstr;
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		// sanity check
		if ( nodeAnim->mNumPositionKeys != nodeAnim->mNumScalingKeys ||  nodeAnim->mNumPositionKeys != nodeAnim->mNumRotationKeys ) continue;
		
		{
            node_idstr.clear();
            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string( "_matrix-input" );

			std::vector<ai_real> frames;
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				frames.push_back(static_cast<ai_real>(nodeAnim->mPositionKeys[i].mTime));
			}
			
			WriteFloatArray( node_idstr , FloatType_Time, (const ai_real*) frames.data(), frames.size());
			frames.clear();
		}
		
		{
            node_idstr.clear();

            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string("_matrix-output");
			
			std::vector<ai_real> keyframes;
			keyframes.reserve(nodeAnim->mNumPositionKeys * 16);
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				aiVector3D Scaling = nodeAnim->mScalingKeys[i].mValue;
				aiMatrix4x4 ScalingM;  // identity
				ScalingM[0][0] = Scaling.x; ScalingM[1][1] = Scaling.y; ScalingM[2][2] = Scaling.z;
				
				aiQuaternion RotationQ = nodeAnim->mRotationKeys[i].mValue;
				aiMatrix4x4 s = aiMatrix4x4( RotationQ.GetMatrix() );
				aiMatrix4x4 RotationM(s.a1, s.a2, s.a3, 0, s.b1, s.b2, s.b3, 0, s.c1, s.c2, s.c3, 0, 0, 0, 0, 1);
				
				aiVector3D Translation = nodeAnim->mPositionKeys[i].mValue;
				aiMatrix4x4 TranslationM;	// identity
				TranslationM[0][3] = Translation.x; TranslationM[1][3] = Translation.y; TranslationM[2][3] = Translation.z;
				
				// Combine the above transformations
				aiMatrix4x4 mat = TranslationM * RotationM * ScalingM;
				
				for( unsigned int j = 0; j < 4; ++j) {
					keyframes.insert(keyframes.end(), mat[j], mat[j] + 4);
                }
			}
			
			WriteFloatArray( node_idstr, FloatType_Mat4x4, (const ai_real*) keyframes.data(), keyframes.size() / 16);
		}
		
		{
			std::vector<std::string> names;
			for ( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				if ( nodeAnim->mPreState == aiAnimBehaviour_DEFAULT
					|| nodeAnim->mPreState == aiAnimBehaviour_LINEAR
					|| nodeAnim->mPreState == aiAnimBehaviour_REPEAT
					) {
					names.push_back( "LINEAR" );
				} else if (nodeAnim->mPostState == aiAnimBehaviour_CONSTANT) {
					names.push_back( "STEP" );
				}
			}
			
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-interpolation");
            std::string arrayId = XMLIDEncode(node_idstr) + "-array";
			
			mOutput << startstr << "<source id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			// source array
			mOutput << startstr << "<Name_array id=\"" << arrayId << "\" count=\"" << names.size() << "\"> ";
			for( size_t a = 0; a < names.size(); ++a ) {
				mOutput << names[a] << " ";
            }
			mOutput << "</Name_array>" << endstr;
			
			mOutput << startstr << "<technique_common>" << endstr;
			PushTag();

			mOutput << startstr << "<accessor source=\"#" << arrayId << "\" count=\"" << names.size() << "\" stride=\"" << 1 << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<param name=\"INTERPOLATION\" type=\"name\"></param>" << endstr;
			
			PopTag();
			mOutput << startstr << "</accessor>" << endstr;
			
			PopTag();
			mOutput << startstr << "</technique_common>" << endstr;

			PopTag();
			mOutput << startstr << "</source>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// samplers
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-sampler");
			mOutput << startstr << "<sampler id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<input semantic=\"INPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-input") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"OUTPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-output") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"INTERPOLATION\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-interpolation") ) << "\"/>" << endstr;
			
			PopTag();
			mOutput << startstr << "</sampler>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// channels
			mOutput << startstr << "<channel source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-sampler") ) << "\" target=\"" << XMLIDEncode(nodeAnim->mNodeName.data) << "/matrix\"/>" << endstr;
		}
	}
	
	PopTag();
	mOutput << startstr << "</animation>" << endstr;
	
}